

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QHash<QStyle::SubControl,_QRect> __thiscall
QStyleSheetStyle::titleBarLayout(QStyleSheetStyle *this,QWidget *w,QStyleOptionTitleBar *tb)

{
  ButtonInfo *pBVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  undefined1 auVar9 [8];
  undefined1 *puVar10;
  QHash<QString,_QVariant> QVar11;
  QSharedDataPointer<QStyleSheetPaletteData> QVar12;
  QSharedDataPointer<QStyleSheetBoxData> QVar13;
  QSharedDataPointer<QStyleSheetBackgroundData> QVar14;
  QSharedDataPointer<QStyleSheetBorderData> QVar15;
  QSharedDataPointer<QStyleSheetOutlineData> QVar16;
  QSharedDataPointer<QStyleSheetGeometryData> QVar17;
  QSharedDataPointer<QStyleSheetPositionData> QVar18;
  QSharedDataPointer<QStyleSheetImageData> QVar19;
  QSharedDataPointer<QStyleSheetImageData> QVar20;
  bool bVar21;
  int iVar22;
  QStyleSheetGeometryData *ptr;
  ulong uVar23;
  QSize QVar24;
  QStyleOption *in_RCX;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *pQVar25;
  long lVar26;
  ButtonInfo *info;
  QVariant *pQVar27;
  ButtonInfo *pBVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  QBrush *pQVar32;
  int iVar33;
  PrivateShared *pPVar34;
  long lVar35;
  QFont *pQVar36;
  QPainterPath *pQVar37;
  long in_FS_OFFSET;
  QByteArrayView layout;
  QRect QVar38;
  QRect QVar39;
  SubControl control;
  QRenderRule subRule;
  int offsets [3];
  QArrayData *d;
  uint local_2c4;
  PrivateShared *local_290;
  QVariant *local_288;
  SubControl local_24c;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> local_248;
  QArrayDataPointer<QVariant> local_228;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined1 *local_1f8 [2];
  bool local_1e8;
  QHash<QString,_QVariant> local_1e0;
  QSharedDataPointer<QStyleSheetPaletteData> QStack_1d8;
  QSharedDataPointer<QStyleSheetBoxData> local_1d0;
  QSharedDataPointer<QStyleSheetBackgroundData> QStack_1c8;
  QSharedDataPointer<QStyleSheetBorderData> local_1c0;
  QSharedDataPointer<QStyleSheetOutlineData> QStack_1b8;
  QSharedDataPointer<QStyleSheetGeometryData> local_1b0;
  QSharedDataPointer<QStyleSheetPositionData> QStack_1a8;
  QSharedDataPointer<QStyleSheetImageData> local_1a0;
  QSharedDataPointer<QStyleSheetImageData> QStack_198;
  int local_190;
  QPainterPath aQStack_188 [8];
  int local_180;
  uint local_17c;
  uint local_178;
  int local_174;
  QRenderRule local_170;
  uint local_e8 [4];
  undefined1 local_d8 [16];
  Data *apDStack_c8 [2];
  bool local_b8;
  QHash<QString,_QVariant> local_b0;
  QSharedDataPointer<QStyleSheetPaletteData> QStack_a8;
  QSharedDataPointer<QStyleSheetBoxData> local_a0;
  QSharedDataPointer<QStyleSheetBackgroundData> QStack_98;
  QSharedDataPointer<QStyleSheetBorderData> local_90;
  QSharedDataPointer<QStyleSheetOutlineData> QStack_88;
  QSharedDataPointer<QStyleSheetGeometryData> local_80;
  QSharedDataPointer<QStyleSheetPositionData> QStack_78;
  QSharedDataPointer<QStyleSheetImageData> local_70;
  QSharedDataPointer<QStyleSheetImageData> QStack_68;
  int local_60;
  Data *pDStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0;
  uVar2 = *(uint *)&in_RCX[1].palette.d;
  memset(&local_170,0xaa,0x88);
  renderRule(&local_170,(QStyleSheetStyle *)w,(QObject *)tb,in_RCX,0);
  QVar38 = QRenderRule::contentsRect(&local_170,&in_RCX->rect);
  local_228.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_228.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_228.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_208 = (undefined1  [8])0xd;
  uStack_200 = "button-layout";
  QHash<QString,_QVariant>::value<QLatin1String,_true>
            ((QVariant *)local_d8,&local_170.styleHints,(QLatin1String *)local_208);
  ::QVariant::toList();
  ::QVariant::~QVariant((QVariant *)local_d8);
  if ((undefined1 *)local_228.size == (undefined1 *)0x0) {
    layout.m_data = "I(T)HSmMX";
    layout.m_size = 9;
    subControlLayout((QList<QVariant> *)local_208,layout);
    puVar10 = local_1f8[0];
    pQVar27 = (QVariant *)uStack_200;
    auVar9 = local_208;
    apDStack_c8[0] = (Data *)local_228.size;
    local_d8._8_8_ = local_228.ptr;
    local_d8._0_8_ = local_228.d;
    local_1f8[0] = (undefined1 *)0x0;
    local_208 = (undefined1  [8])0x0;
    uStack_200 = (char *)0x0;
    local_228.d = (Data *)auVar9;
    local_228.ptr = pQVar27;
    local_228.size = (qsizetype)puVar10;
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_d8);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_208);
  }
  local_e8[2] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  local_248.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_248.ptr = (ButtonInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_248.ptr =
       (ButtonInfo *)QArrayData::allocate((QArrayData **)local_d8,0x98,0x10,local_228.size,KeepSize)
  ;
  if ((PrivateShared *)local_d8._0_8_ != (PrivateShared *)0x0) {
    *(undefined1 *)(local_d8._0_8_ + 4) = *(undefined1 *)(local_d8._0_8_ + 4) | 1;
  }
  local_248.d = (Data *)local_d8._0_8_;
  local_d8._0_8_ = (PrivateShared *)0x0;
  local_d8._8_8_ = 0;
  apDStack_c8[0] = (Data *)0x0;
  local_248.size = 0;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer
            ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)local_d8);
  if ((undefined1 *)local_228.size != (undefined1 *)0x0) {
    lVar35 = local_228.size << 5;
    local_2c4 = 0;
    pQVar27 = local_228.ptr;
    do {
      iVar22 = ::QVariant::toInt((bool *)pQVar27);
      if (iVar22 == 0x28) {
        local_2c4 = 2;
        goto LAB_003520f2;
      }
      if (iVar22 == 0x29) {
        local_2c4 = 1;
        goto LAB_003520f2;
      }
      memset((QRenderRule *)local_208,0xaa,0x98);
      QRenderRule::QRenderRule((QRenderRule *)local_208);
      local_180 = iVar22;
      switch(iVar22) {
      case 0x41:
        if (((ulong)in_RCX[1].palette.d & 0x300000000000) == 0) break;
        iVar22 = QFontMetrics::horizontalAdvance((QString *)&in_RCX->fontMetrics,(int)in_RCX + 0x48)
        ;
        local_174 = iVar22 + 6;
        ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
        iVar29 = QFontMetrics::height();
        ptr->super_QSharedData = (QAtomicInt)0x0;
        ptr->minWidth = -1;
        ptr->minHeight = -1;
        ptr->width = iVar22 + 6;
        ptr->height = iVar29;
        ptr->maxWidth = -1;
        ptr->maxHeight = -1;
        QSharedDataPointer<QStyleSheetGeometryData>::reset(&local_170.geo,ptr);
        goto LAB_00351a45;
      case 0x42:
      case 0x49:
        bVar5 = *(byte *)((long)&in_RCX[1].palette.d + 5) & 0x20;
        goto joined_r0x003518bb;
      case 0x43:
        if (((ulong)in_RCX[1].palette.d & 0x400000000000) == 0) break;
        iVar29 = 0x47;
        iVar22 = 0x43;
LAB_00351971:
        uVar6 = uVar2 & 1;
joined_r0x00352112:
        if (uVar6 != 0) {
          iVar22 = iVar29;
          local_180 = iVar29;
        }
        goto LAB_00351982;
      case 0x44:
        if (((ulong)in_RCX[1].palette.d & 0x800000000000) != 0) {
          iVar29 = 0x47;
          iVar22 = 0x44;
          uVar6 = uVar2 & 2;
          goto joined_r0x00352112;
        }
        break;
      case 0x45:
        if (((ulong)in_RCX[1].palette.d & 0x2000000000000) != 0) {
          iVar29 = 0x46;
          iVar22 = 0x45;
          goto LAB_00351971;
        }
        break;
      case 0x48:
        bVar5 = *(byte *)((long)&in_RCX[1].palette.d + 6) & 1;
        iVar22 = 0x48;
joined_r0x003518bb:
        if (bVar5 == 0) break;
LAB_00351982:
        renderRule((QRenderRule *)local_d8,(QStyleSheetStyle *)w,(QObject *)tb,in_RCX,iVar22);
        QRenderRule::operator=(&local_170,(QRenderRule *)local_d8);
        QRenderRule::~QRenderRule((QRenderRule *)local_d8);
        if (local_170.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
          uVar23 = 0xffffffff;
          if ((local_170.img.d.ptr == (QStyleSheetImageData *)0x0) ||
             ((((QSize *)((long)local_170.img.d.ptr + 0x14))->wd).m_i < 0)) {
            QVar24.wd.m_i = -1;
            QVar24.ht.m_i = 0;
          }
          else {
            QVar24.wd.m_i = -1;
            QVar24.ht.m_i = 0;
            if (-1 < ((Representation *)((long)local_170.img.d.ptr + 0x18))->m_i) {
              QVar24 = *(QSize *)((long)local_170.img.d.ptr + 0x14);
              uVar23 = (ulong)QVar24 >> 0x20;
            }
          }
        }
        else {
          QVar24.ht.m_i = 0;
          QVar24.wd.m_i = *(int *)((long)local_170.geo.d.ptr + 0xc);
          uVar23 = (ulong)(uint)*(int *)((long)local_170.geo.d.ptr + 0x10);
        }
        local_d8._0_8_ = (ulong)QVar24 & 0xffffffff | uVar23 << 0x20;
        QVar24 = QRenderRule::boxSize(&local_170,(QSize *)local_d8,7);
        local_174 = (int)QVar24.wd.m_i;
LAB_00351a45:
        QRenderRule::operator=((QRenderRule *)local_208,&local_170);
        qVar7 = local_248.size;
        pBVar28 = local_248.ptr;
        pPVar34 = (PrivateShared *)local_248.d;
        local_17c = local_e8[local_2c4];
        local_178 = local_2c4;
        pQVar25 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                  (ulong)(local_17c + local_174);
        local_e8[local_2c4] = local_17c + local_174;
        if (((PrivateShared *)local_248.d == (PrivateShared *)0x0) ||
           (1 < *(int *)&(local_248.d)->super_QArrayData)) {
LAB_00351a9b:
          memset(local_d8,0xaa,0x98);
          local_d8._0_4_ = local_208._0_4_;
          QBrush::QBrush((QBrush *)(local_d8 + 8),(QBrush *)&uStack_200);
          QFont::QFont((QFont *)apDStack_c8,(QFont *)local_1f8);
          QStack_68.d.ptr = QStack_198.d.ptr;
          local_70.d.ptr = local_1a0.d.ptr;
          QStack_78.d.ptr = QStack_1a8.d.ptr;
          local_80.d.ptr = local_1b0.d.ptr;
          QStack_88.d.ptr = QStack_1b8.d.ptr;
          local_90.d.ptr = local_1c0.d.ptr;
          QStack_98.d.ptr = QStack_1c8.d.ptr;
          local_a0.d.ptr = local_1d0.d.ptr;
          QStack_a8.d.ptr = QStack_1d8.d.ptr;
          local_b0.d = local_1e0.d;
          local_b8 = local_1e8;
          local_1e0.d = (Data *)0x0;
          QStack_1d8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPaletteData_*>)(QStyleSheetPaletteData *)0x0;
          local_1d0.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)(QStyleSheetBoxData *)0x0
          ;
          QStack_1c8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
               (QStyleSheetBackgroundData *)0x0;
          local_1c0.d.ptr =
               (totally_ordered_wrapper<QStyleSheetBorderData_*>)(QStyleSheetBorderData *)0x0;
          QStack_1b8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(QStyleSheetOutlineData *)0x0;
          local_1b0.d.ptr =
               (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
          QStack_1a8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
          local_1a0.d.ptr =
               (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
          QStack_198.d.ptr =
               (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
          local_60 = local_190;
          QPainterPath::QPainterPath((QPainterPath *)&pDStack_58,aQStack_188);
          local_50 = CONCAT44(local_17c,local_180);
          uStack_48 = CONCAT44(local_174,local_178);
          if (((pPVar34 == (PrivateShared *)0x0) ||
              (1 < *(int *)&((Data *)pPVar34)->super_QArrayData)) ||
             ((pQVar25 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                         (((long)((long)local_248.ptr -
                                 ((ulong)((Data *)pPVar34 + 0x1f) & 0xfffffffffffffff0)) >> 3) *
                         0x79435e50d79435e5),
              (*(long *)((Data *)pPVar34 + 8) - qVar7) + (long)pQVar25 < 1 &&
              (bVar21 = QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::tryReadjustFreeSpace
                                  (&local_248,GrowsAtEnd,0x79435e50d79435e5,(ButtonInfo **)pQVar25),
              !bVar21)))) {
            QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
                      (&local_248,GrowsAtEnd,1,pQVar25);
          }
          qVar8 = local_248.size;
          pBVar28 = local_248.ptr;
          memmove(local_248.ptr + qVar7 + 1,local_248.ptr + qVar7,(local_248.size - qVar7) * 0x98);
          pQVar32 = &pBVar28[qVar7].rule.defaultBackground;
          ((QRenderRule *)(pQVar32 + -8))->features = local_d8._0_4_;
          QBrush::QBrush(pQVar32,(QBrush *)(local_d8 + 8));
          pQVar36 = &pBVar28[qVar7].rule.font;
          QFont::QFont(pQVar36,(QFont *)apDStack_c8);
          QVar20.d.ptr = QStack_68.d.ptr;
          QVar19.d.ptr = local_70.d.ptr;
          QVar18.d.ptr = QStack_78.d.ptr;
          QVar17.d.ptr = local_80.d.ptr;
          QVar16.d.ptr = QStack_88.d.ptr;
          QVar15.d.ptr = local_90.d.ptr;
          QVar14.d.ptr = QStack_98.d.ptr;
          QVar13.d.ptr = local_a0.d.ptr;
          QVar12.d.ptr = QStack_a8.d.ptr;
          QVar11.d = local_b0.d;
          pQVar36[0x10] = (QFont)local_b8;
          pQVar25 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x0;
          local_b0.d = (Data *)0x0;
          ((QHash<QString,_QVariant> *)(pQVar36 + 0x18))->d = QVar11.d;
          QStack_a8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPaletteData_*>)(QStyleSheetPaletteData *)0x0;
          (((QSharedDataPointer<QStyleSheetPaletteData> *)(pQVar36 + 0x20))->d).ptr =
               (QStyleSheetPaletteData *)QVar12.d.ptr;
          local_a0.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)(QStyleSheetBoxData *)0x0;
          (((QSharedDataPointer<QStyleSheetBoxData> *)(pQVar36 + 0x28))->d).ptr =
               (QStyleSheetBoxData *)QVar13.d.ptr;
          QStack_98.d.ptr =
               (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
               (QStyleSheetBackgroundData *)0x0;
          (((QSharedDataPointer<QStyleSheetBackgroundData> *)(pQVar36 + 0x30))->d).ptr =
               (QStyleSheetBackgroundData *)QVar14.d.ptr;
          local_90.d.ptr =
               (totally_ordered_wrapper<QStyleSheetBorderData_*>)(QStyleSheetBorderData *)0x0;
          (((QSharedDataPointer<QStyleSheetBorderData> *)(pQVar36 + 0x38))->d).ptr =
               (QStyleSheetBorderData *)QVar15.d.ptr;
          QStack_88.d.ptr =
               (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(QStyleSheetOutlineData *)0x0;
          (((QSharedDataPointer<QStyleSheetOutlineData> *)(pQVar36 + 0x40))->d).ptr =
               (QStyleSheetOutlineData *)QVar16.d.ptr;
          local_80.d.ptr =
               (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
          (((QSharedDataPointer<QStyleSheetGeometryData> *)(pQVar36 + 0x48))->d).ptr =
               (QStyleSheetGeometryData *)QVar17.d.ptr;
          QStack_78.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
          (((QSharedDataPointer<QStyleSheetPositionData> *)(pQVar36 + 0x50))->d).ptr =
               (QStyleSheetPositionData *)QVar18.d.ptr;
          local_70.d.ptr =
               (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
          (((QSharedDataPointer<QStyleSheetImageData> *)(pQVar36 + 0x58))->d).ptr =
               (QStyleSheetImageData *)QVar19.d.ptr;
          QStack_68.d.ptr =
               (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
          (((QSharedDataPointer<QStyleSheetImageData> *)(pQVar36 + 0x60))->d).ptr =
               (QStyleSheetImageData *)QVar20.d.ptr;
          *(int *)(pQVar36 + 0x68) = local_60;
          pQVar37 = &pBVar28[qVar7].rule.clipPath;
          QPainterPath::QPainterPath(pQVar37,(QPainterPath *)&pDStack_58);
          *(undefined8 *)(pQVar37 + 8) = local_50;
          *(undefined8 *)(pQVar37 + 0x10) = uStack_48;
          local_248.size = qVar8 + 1;
          QRenderRule::~QRenderRule((QRenderRule *)local_d8);
          pPVar34 = (PrivateShared *)local_248.d;
          if ((PrivateShared *)local_248.d != (PrivateShared *)0x0) goto LAB_003520c9;
LAB_003520d2:
          QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
                    (&local_248,GrowsAtEnd,0,pQVar25);
        }
        else {
          if (*(long *)((long)local_248.d + 8) - local_248.size ==
              ((long)local_248.ptr - (long)((ulong)((long)local_248.d + 0x1fU) & 0xfffffffffffffff0)
              >> 3) * -0x79435e50d79435e5) {
            pQVar25 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                      CONCAT71((int7)((ulong)(*(long *)((long)local_248.d + 8) - local_248.size) >>
                                     8),local_248.size != 0);
            if ((ButtonInfo *)((ulong)((long)local_248.d + 0x1fU) & 0xfffffffffffffff0) ==
                local_248.ptr || local_248.size != 0) goto LAB_00351a9b;
            pBVar1 = local_248.ptr + -1;
            local_248.ptr[-1].rule.features = local_208._0_4_;
            QBrush::QBrush((QBrush *)&local_248.ptr[-1].rule.defaultBackground,(QBrush *)&uStack_200
                          );
            QFont::QFont(&pBVar28[-1].rule.font,(QFont *)local_1f8);
            QVar20.d.ptr = QStack_198.d.ptr;
            QVar19.d.ptr = local_1a0.d.ptr;
            QVar18.d.ptr = QStack_1a8.d.ptr;
            QVar17.d.ptr = local_1b0.d.ptr;
            QVar16.d.ptr = QStack_1b8.d.ptr;
            QVar15.d.ptr = local_1c0.d.ptr;
            QVar14.d.ptr = QStack_1c8.d.ptr;
            QVar13.d.ptr = local_1d0.d.ptr;
            QVar12.d.ptr = QStack_1d8.d.ptr;
            QVar11.d = local_1e0.d;
            pBVar28[-1].rule.hasFont = local_1e8;
            pQVar25 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x0;
            local_1e0.d = (Data *)0x0;
            pBVar28[-1].rule.styleHints.d = QVar11.d;
            QStack_1d8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPaletteData_*>)(QStyleSheetPaletteData *)0x0;
            pBVar28[-1].rule.pal.d.ptr = (QStyleSheetPaletteData *)QVar12.d.ptr;
            local_1d0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBoxData_*>)(QStyleSheetBoxData *)0x0;
            pBVar28[-1].rule.b.d.ptr = (QStyleSheetBoxData *)QVar13.d.ptr;
            QStack_1c8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
                 (QStyleSheetBackgroundData *)0x0;
            pBVar28[-1].rule.bg.d.ptr = (QStyleSheetBackgroundData *)QVar14.d.ptr;
            local_1c0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBorderData_*>)(QStyleSheetBorderData *)0x0;
            pBVar28[-1].rule.bd.d.ptr = (QStyleSheetBorderData *)QVar15.d.ptr;
            QStack_1b8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(QStyleSheetOutlineData *)0x0;
            pBVar28[-1].rule.ou.d.ptr = (QStyleSheetOutlineData *)QVar16.d.ptr;
            local_1b0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
            pBVar28[-1].rule.geo.d.ptr = (QStyleSheetGeometryData *)QVar17.d.ptr;
            QStack_1a8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
            pBVar28[-1].rule.p.d.ptr = (QStyleSheetPositionData *)QVar18.d.ptr;
            local_1a0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
            pBVar28[-1].rule.img.d.ptr = (QStyleSheetImageData *)QVar19.d.ptr;
            QStack_198.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
            pBVar28[-1].rule.iconPtr.d.ptr = (QStyleSheetImageData *)QVar20.d.ptr;
            pBVar28[-1].rule.clipset = local_190;
            QPainterPath::QPainterPath(&pBVar28[-1].rule.clipPath,aQStack_188);
            pBVar28[-1].element = local_180;
            pBVar28[-1].offset = local_17c;
            pBVar28[-1].where = local_178;
            pBVar28[-1].width = local_174;
            local_248.size = 1;
            local_248.ptr = pBVar1;
          }
          else {
            pQVar32 = &local_248.ptr[local_248.size].rule.defaultBackground;
            ((QRenderRule *)(pQVar32 + -8))->features = local_208._0_4_;
            QBrush::QBrush(pQVar32,(QBrush *)&uStack_200);
            pQVar36 = &pBVar28[qVar7].rule.font;
            QFont::QFont(pQVar36,(QFont *)local_1f8);
            QVar20.d.ptr = QStack_198.d.ptr;
            QVar19.d.ptr = local_1a0.d.ptr;
            QVar18.d.ptr = QStack_1a8.d.ptr;
            QVar17.d.ptr = local_1b0.d.ptr;
            QVar16.d.ptr = QStack_1b8.d.ptr;
            QVar15.d.ptr = local_1c0.d.ptr;
            QVar14.d.ptr = QStack_1c8.d.ptr;
            QVar13.d.ptr = local_1d0.d.ptr;
            QVar12.d.ptr = QStack_1d8.d.ptr;
            QVar11.d = local_1e0.d;
            pQVar36[0x10] = (QFont)local_1e8;
            pQVar25 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x0;
            local_1e0.d = (Data *)0x0;
            ((QHash<QString,_QVariant> *)(pQVar36 + 0x18))->d = QVar11.d;
            QStack_1d8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPaletteData_*>)(QStyleSheetPaletteData *)0x0;
            (((QSharedDataPointer<QStyleSheetPaletteData> *)(pQVar36 + 0x20))->d).ptr =
                 (QStyleSheetPaletteData *)QVar12.d.ptr;
            local_1d0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBoxData_*>)(QStyleSheetBoxData *)0x0;
            (((QSharedDataPointer<QStyleSheetBoxData> *)(pQVar36 + 0x28))->d).ptr =
                 (QStyleSheetBoxData *)QVar13.d.ptr;
            QStack_1c8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
                 (QStyleSheetBackgroundData *)0x0;
            (((QSharedDataPointer<QStyleSheetBackgroundData> *)(pQVar36 + 0x30))->d).ptr =
                 (QStyleSheetBackgroundData *)QVar14.d.ptr;
            local_1c0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBorderData_*>)(QStyleSheetBorderData *)0x0;
            (((QSharedDataPointer<QStyleSheetBorderData> *)(pQVar36 + 0x38))->d).ptr =
                 (QStyleSheetBorderData *)QVar15.d.ptr;
            QStack_1b8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(QStyleSheetOutlineData *)0x0;
            (((QSharedDataPointer<QStyleSheetOutlineData> *)(pQVar36 + 0x40))->d).ptr =
                 (QStyleSheetOutlineData *)QVar16.d.ptr;
            local_1b0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
            (((QSharedDataPointer<QStyleSheetGeometryData> *)(pQVar36 + 0x48))->d).ptr =
                 (QStyleSheetGeometryData *)QVar17.d.ptr;
            QStack_1a8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
            (((QSharedDataPointer<QStyleSheetPositionData> *)(pQVar36 + 0x50))->d).ptr =
                 (QStyleSheetPositionData *)QVar18.d.ptr;
            local_1a0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
            (((QSharedDataPointer<QStyleSheetImageData> *)(pQVar36 + 0x58))->d).ptr =
                 (QStyleSheetImageData *)QVar19.d.ptr;
            QStack_198.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
            (((QSharedDataPointer<QStyleSheetImageData> *)(pQVar36 + 0x60))->d).ptr =
                 (QStyleSheetImageData *)QVar20.d.ptr;
            *(int *)(pQVar36 + 0x68) = local_190;
            pQVar37 = &pBVar28[qVar7].rule.clipPath;
            QPainterPath::QPainterPath(pQVar37,aQStack_188);
            *(ulong *)(pQVar37 + 8) = CONCAT44(local_17c,local_180);
            *(ulong *)(pQVar37 + 0x10) = CONCAT44(local_174,local_178);
            local_248.size = qVar7 + 1;
          }
LAB_003520c9:
          if (1 < *(int *)&pPVar34->field_0x0) goto LAB_003520d2;
        }
        QRenderRule::~QRenderRule((QRenderRule *)local_208);
        goto LAB_003520f2;
      }
      QRenderRule::~QRenderRule((QRenderRule *)local_208);
LAB_003520f2:
      pQVar27 = pQVar27 + 1;
      lVar35 = lVar35 + -0x20;
    } while (lVar35 != 0);
    if (local_248.size != 0) {
      local_288 = QVar38._8_8_;
      iVar33 = QVar38.x2.m_i.m_i - local_e8[1];
      local_290 = QVar38._0_8_;
      lVar30 = (long)iVar33 + (long)QVar38.x1.m_i.m_i + (long)(int)local_e8[0];
      iVar22 = local_e8[2] - ((int)(local_e8[2] + -1) >> 0x1f);
      iVar29 = QVar38.y2.m_i.m_i - QVar38.y1.m_i;
      lVar35 = ((long)local_288 >> 0x20) + ((long)local_290 >> 0x20);
      iVar31 = (int)((ulong)(lVar35 - (lVar35 >> 0x3f)) >> 1) - iVar29 / 2;
      lVar35 = local_248.size * 0x98;
      pBVar28 = local_248.ptr;
      do {
        local_208 = (undefined1  [8])local_290;
        uStack_200 = (char *)local_288;
        iVar3 = pBVar28->where;
        if (iVar3 == 0) {
          local_208._0_4_ = pBVar28->offset + QVar38.x1.m_i.m_i;
LAB_0035226b:
          local_208._4_4_ = QVar38.y1.m_i.m_i;
          uStack_200 = (char *)CONCAT44(QVar38.y2.m_i.m_i,local_208._0_4_ + pBVar28->width + -1);
        }
        else {
          if (iVar3 == 1) {
            local_208._0_4_ = pBVar28->offset + iVar33 + 1;
            goto LAB_0035226b;
          }
          if (iVar3 == 2) {
            local_208._0_4_ =
                 pBVar28->offset +
                 ((int)((ulong)(lVar30 - (lVar30 >> 0x3f)) >> 1) - (iVar22 + -1 >> 1));
            local_208._4_4_ = iVar31;
            uStack_200 = (char *)CONCAT44(iVar29 + iVar31,pBVar28->width + local_208._0_4_ + -1);
          }
        }
        local_24c = knownPseudoElements[pBVar28->element].subControl;
        QVar39 = positionRect((QStyleSheetStyle *)w,(QWidget *)tb,&pBVar28->rule,pBVar28->element,
                              (QRect *)local_208,in_RCX->direction);
        QHash<QStyle::SubControl,QRect>::tryEmplace_impl<QStyle::SubControl_const&>
                  ((TryEmplaceResult *)local_d8,this,&local_24c);
        lVar26 = ((ulong)local_d8._8_8_ >> 7) * 0x90;
        lVar4 = *(long *)(*(long *)(local_d8._0_8_ + 0x20) + 0x80 + lVar26);
        uVar23 = (ulong)*(byte *)((ulong)((uint)local_d8._8_8_ & 0x7f) +
                                 *(long *)(local_d8._0_8_ + 0x20) + lVar26);
        *(long *)(lVar4 + 4 + uVar23 * 0x14) = QVar39._0_8_;
        *(long *)(lVar4 + 0xc + uVar23 * 0x14) = QVar39._8_8_;
        pBVar28 = pBVar28 + 1;
        lVar35 = lVar35 + -0x98;
      } while (lVar35 != 0);
    }
  }
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer(&local_248);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_228);
  QRenderRule::~QRenderRule(&local_170);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QHash<QStyle::SubControl,_QRect>)(Data *)this;
}

Assistant:

QHash<QStyle::SubControl, QRect> QStyleSheetStyle::titleBarLayout(const QWidget *w, const QStyleOptionTitleBar *tb) const
{
    QHash<QStyle::SubControl, QRect> layoutRects;
    const bool isMinimized = tb->titleBarState & Qt::WindowMinimized;
    const bool isMaximized = tb->titleBarState & Qt::WindowMaximized;
    QRenderRule subRule = renderRule(w, tb);
    QRect cr = subRule.contentsRect(tb->rect);
    QList<QVariant> layout = subRule.styleHint("button-layout"_L1).toList();
    if (layout.isEmpty())
        layout = subControlLayout("I(T)HSmMX"_L1);

    int offsets[3] = { 0, 0, 0 };
    enum Where { Left, Right, Center, NoWhere } where = Left;
    QList<ButtonInfo> infos;
    infos.reserve(layout.size());
    for (const QVariant &val : std::as_const(layout)) {
        const int element = val.toInt();
        if (element == '(') {
            where = Center;
        } else if (element == ')') {
            where = Right;
        } else {
            ButtonInfo info;
            info.element = element;
            switch (element) {
            case PseudoElement_TitleBar:
                if (!(tb->titleBarFlags & (Qt::WindowTitleHint | Qt::WindowSystemMenuHint)))
                    continue;
                break;
            case PseudoElement_TitleBarContextHelpButton:
                if (!(tb->titleBarFlags & Qt::WindowContextHelpButtonHint))
                    continue;
                break;
            case PseudoElement_TitleBarMinButton:
                if (!(tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    continue;
                if (isMinimized)
                    info.element = PseudoElement_TitleBarNormalButton;
                break;
            case PseudoElement_TitleBarMaxButton:
                if (!(tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    continue;
                if (isMaximized)
                    info.element = PseudoElement_TitleBarNormalButton;
                break;
            case PseudoElement_TitleBarShadeButton:
                if (!(tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    continue;
                if (isMinimized)
                    info.element = PseudoElement_TitleBarUnshadeButton;
                break;
            case PseudoElement_TitleBarCloseButton:
            case PseudoElement_TitleBarSysMenu:
                if (!(tb->titleBarFlags & Qt::WindowSystemMenuHint))
                    continue;
                break;
            default:
                continue;
            }
            if (info.element == PseudoElement_TitleBar) {
                info.width = tb->fontMetrics.horizontalAdvance(tb->text) + 6;
                subRule.geo = new QStyleSheetGeometryData(info.width, tb->fontMetrics.height(), -1, -1, -1, -1);
            } else {
                subRule = renderRule(w, tb, info.element);
                info.width = subRule.size().width();
            }
            info.rule = subRule;
            info.offset = offsets[where];
            info.where = where;
            offsets[where] += info.width;

            infos.append(std::move(info));
        }
    }

    for (const ButtonInfo &info : std::as_const(infos)) {
        QRect lr = cr;
        switch (info.where) {
        case Center: {
            lr.setLeft(cr.left() + offsets[Left]);
            lr.setRight(cr.right() - offsets[Right]);
            QRect r(0, 0, offsets[Center], lr.height());
            r.moveCenter(lr.center());
            r.setLeft(r.left()+info.offset);
            r.setWidth(info.width);
            lr = r;
            break; }
        case Left:
            lr.translate(info.offset, 0);
            lr.setWidth(info.width);
            break;
        case Right:
            lr.moveLeft(cr.right() + 1 - offsets[Right] + info.offset);
            lr.setWidth(info.width);
            break;
        default:
            break;
        }
        QStyle::SubControl control = knownPseudoElements[info.element].subControl;
        layoutRects[control] = positionRect(w, info.rule, info.element, lr, tb->direction);
    }

    return layoutRects;
}